

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_adapt.c
# Opt level: O3

REF_STATUS ref_adapt_parameter(REF_GRID ref_grid,REF_BOOL *all_done)

{
  REF_MPI ref_mpi;
  REF_NODE ref_node;
  REF_ADAPT pRVar1;
  REF_CELL pRVar2;
  bool bVar3;
  bool bVar4;
  uint uVar5;
  REF_STATUS RVar6;
  long lVar7;
  undefined8 uVar8;
  ulong uVar9;
  char *pcVar10;
  int iVar11;
  REF_INT cell;
  double dVar12;
  REF_DBL RVar13;
  double dVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  double dVar17;
  REF_INT max_age;
  REF_INT max_degree;
  REF_DBL min_normdev;
  REF_INT nnode;
  REF_DBL complexity;
  REF_DBL max_det;
  REF_INT int_mixed;
  REF_INT part;
  REF_DBL max_volume;
  REF_DBL min_volume;
  REF_DBL volume;
  REF_DBL min_quality;
  REF_INT degree;
  REF_DBL max_ratio;
  REF_DBL min_ratio;
  REF_DBL quality;
  REF_EDGE ref_edge;
  REF_DBL ratio;
  REF_DBL det;
  REF_LONG ncell;
  REF_DBL normdev;
  REF_INT local_mixed;
  REF_INT age;
  REF_DBL m [6];
  REF_INT nodes [27];
  uint local_1c0;
  uint local_1bc;
  REF_ADAPT local_1b8;
  REF_DBL local_1b0;
  uint local_1a4;
  double local_1a0;
  double local_198;
  int local_190;
  int local_18c;
  REF_DBL local_188;
  double local_180;
  double local_178;
  double local_170;
  double local_168;
  double local_160;
  uint local_154;
  REF_DBL local_150;
  double local_148;
  REF_DBL local_140;
  double local_138;
  REF_BOOL *local_130;
  REF_EDGE local_128;
  double local_120;
  double local_118;
  long local_110;
  int local_104;
  double local_100;
  double local_f8;
  double local_f0;
  double local_e8;
  undefined4 local_e0;
  uint local_dc;
  double local_d8;
  double local_d0;
  double local_c8;
  double local_c0;
  double local_b8;
  double local_b0;
  REF_INT local_a8 [30];
  
  ref_mpi = ref_grid->mpi;
  ref_node = ref_grid->node;
  pRVar1 = ref_grid->adapt;
  local_190 = 0;
  if ((((ref_grid->cell[6]->n < 1) && (ref_grid->cell[9]->n < 1)) && (ref_grid->cell[10]->n < 1)) &&
     (ref_grid->cell[0xb]->n < 1)) {
    local_e0 = 0;
  }
  else {
    local_190 = 1;
    local_e0 = 1;
  }
  uVar5 = ref_mpi_max(ref_mpi,&local_e0,&local_190,1);
  if (uVar5 != 0) {
    pcVar10 = "mpi max";
    uVar8 = 0x9d;
    goto LAB_001ccee0;
  }
  lVar7 = 0x28;
  if ((ref_grid->twod == 0) && (ref_grid->surf == 0)) {
    lVar7 = 0x50;
  }
  local_104 = local_190;
  pRVar2 = *(REF_CELL *)((long)ref_grid->cell + lVar7 + -0x10);
  local_160 = 1.0;
  local_170 = 1e+200;
  local_178 = -1e+200;
  local_198 = -1.0;
  cell = 0;
  local_1a0 = 0.0;
  local_110 = 0;
  local_1b8 = pRVar1;
  local_130 = all_done;
  if (0 < pRVar2->max) {
    do {
      RVar6 = ref_cell_nodes(pRVar2,cell,local_a8);
      if (RVar6 == 0) {
        if ((ref_grid->twod == 0) && (ref_grid->surf == 0)) {
          uVar5 = ref_node_tet_quality(ref_grid->node,local_a8,&local_138);
          if (uVar5 != 0) {
            pcVar10 = "qual";
            uVar8 = 0xb3;
            goto LAB_001ccee0;
          }
          uVar5 = ref_node_tet_vol(ref_grid->node,local_a8,&local_168);
          if (uVar5 != 0) {
            pcVar10 = "vol";
            uVar8 = 0xb4;
            goto LAB_001ccee0;
          }
        }
        else {
          uVar5 = ref_node_tri_quality(ref_grid->node,local_a8,&local_138);
          if (uVar5 != 0) {
            pcVar10 = "qual";
            uVar8 = 0xaf;
            goto LAB_001ccee0;
          }
          uVar5 = ref_node_tri_area(ref_grid->node,local_a8,&local_168);
          if (uVar5 != 0) {
            pcVar10 = "vol";
            uVar8 = 0xb0;
            goto LAB_001ccee0;
          }
        }
        if (local_138 <= local_160) {
          local_160 = local_138;
        }
        if (local_168 <= local_170) {
          local_170 = local_168;
        }
        if (local_178 <= local_168) {
          local_178 = local_168;
        }
        if (0 < pRVar2->node_per) {
          lVar7 = 0;
          do {
            if (ref_node->ref_mpi->id == ref_node->part[local_a8[lVar7]]) {
              uVar5 = ref_node_metric_get(ref_node,local_a8[lVar7],&local_d8);
              if (uVar5 != 0) {
                pcVar10 = "get";
                uVar8 = 0xbc;
                goto LAB_001ccee0;
              }
              uVar5 = ref_matrix_det_m(&local_d8,&local_118);
              if (uVar5 != 0) {
                pcVar10 = "det";
                uVar8 = 0xbd;
                goto LAB_001ccee0;
              }
              if (local_198 <= local_118) {
                local_198 = local_118;
              }
              if (ref_grid->surf == 0) {
                if (0.0 < local_118) {
                  if (local_118 < 0.0) {
                    dVar12 = sqrt(local_118);
                  }
                  else {
                    dVar12 = SQRT(local_118);
                  }
                  dVar12 = dVar12 * local_168;
LAB_001cd279:
                  local_1a0 = dVar12 / (double)pRVar2->node_per + local_1a0;
                }
              }
              else {
                uVar5 = ref_node_tri_area(ref_grid->node,local_a8,&local_1b0);
                if (uVar5 != 0) {
                  pcVar10 = "vol";
                  uVar8 = 0xc1;
                  goto LAB_001ccee0;
                }
                uVar5 = ref_node_tri_normal(ref_grid->node,local_a8,&local_f8);
                if (uVar5 != 0) {
                  pcVar10 = "norm";
                  uVar8 = 0xc3;
                  goto LAB_001ccee0;
                }
                RVar6 = ref_math_normalize(&local_f8);
                if (RVar6 == 0) {
                  dVar12 = (local_b0 * local_e8 + local_c8 * local_f8 + local_f0 * local_b8) *
                           local_e8 +
                           (local_c8 * local_e8 + local_d8 * local_f8 + local_d0 * local_f0) *
                           local_f8 +
                           (local_b8 * local_e8 + local_d0 * local_f8 + local_c0 * local_f0) *
                           local_f0;
                  auVar15._0_8_ = dVar12 * 1e+20;
                  auVar15._8_8_ = local_118;
                  auVar16._8_8_ = -local_118;
                  auVar16._0_8_ = -auVar15._0_8_;
                  auVar16 = maxpd(auVar15,auVar16);
                  if (auVar16._8_8_ < auVar16._0_8_) {
                    dVar12 = local_118 / dVar12;
                    if (0.0 < dVar12) {
                      if (dVar12 < 0.0) {
                        dVar12 = sqrt(dVar12);
                      }
                      else {
                        dVar12 = SQRT(dVar12);
                      }
                      dVar12 = dVar12 * local_1b0;
                      goto LAB_001cd279;
                    }
                  }
                }
              }
            }
            lVar7 = lVar7 + 1;
          } while (lVar7 < pRVar2->node_per);
        }
        uVar5 = ref_cell_part(pRVar2,ref_node,cell,&local_18c);
        if (uVar5 != 0) {
          pcVar10 = "owner";
          uVar8 = 0xd6;
          goto LAB_001ccee0;
        }
        if (local_18c == ref_mpi->id) {
          local_110 = local_110 + 1;
        }
      }
      cell = cell + 1;
    } while (cell < pRVar2->max);
  }
  local_138 = local_160;
  uVar5 = ref_mpi_min(ref_mpi,&local_138,&local_160,3);
  if (uVar5 != 0) {
    pcVar10 = "mpi min";
    uVar8 = 0xda;
    goto LAB_001ccee0;
  }
  uVar5 = ref_mpi_bcast(ref_mpi,&local_138,1,3);
  if (uVar5 != 0) {
    pcVar10 = "mbast";
    uVar8 = 0xdb;
    goto LAB_001ccee0;
  }
  local_168 = local_170;
  uVar5 = ref_mpi_min(ref_mpi,&local_168,&local_170,3);
  if (uVar5 != 0) {
    pcVar10 = "mpi min";
    uVar8 = 0xdd;
    goto LAB_001ccee0;
  }
  uVar5 = ref_mpi_bcast(ref_mpi,&local_170,1,3);
  if (uVar5 != 0) {
    pcVar10 = "bcast";
    uVar8 = 0xde;
    goto LAB_001ccee0;
  }
  local_168 = local_178;
  uVar5 = ref_mpi_max(ref_mpi,&local_168,&local_178,3);
  if (uVar5 != 0) {
    pcVar10 = "mpi max";
    uVar8 = 0xe0;
    goto LAB_001ccee0;
  }
  uVar5 = ref_mpi_bcast(ref_mpi,&local_178,1,3);
  if (uVar5 != 0) {
    pcVar10 = "bcast";
    uVar8 = 0xe1;
    goto LAB_001ccee0;
  }
  local_118 = local_198;
  uVar5 = ref_mpi_max(ref_mpi,&local_118,&local_198,3);
  if (uVar5 != 0) {
    pcVar10 = "mpi max";
    uVar8 = 0xe3;
    goto LAB_001ccee0;
  }
  uVar5 = ref_mpi_bcast(ref_mpi,&local_198,1,3);
  if (uVar5 != 0) {
    pcVar10 = "bcast";
    uVar8 = 0xe4;
    goto LAB_001ccee0;
  }
  if (local_198 < 0.0) {
    local_180 = sqrt(local_198);
  }
  else {
    local_180 = SQRT(local_198);
  }
  local_180 = local_180 * 1e+20;
  if (local_198 < 0.0) {
    dVar12 = sqrt(local_198);
  }
  else {
    dVar12 = SQRT(local_198);
  }
  if (dVar12 * *(double *)(&DAT_0021ed00 + (ulong)(0.0 < local_180) * 8) <= 1.0) {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_adapt.c",0xe5,
           "ref_adapt_parameter","can not invert sqrt(max_det)");
    return 1;
  }
  if (local_198 < 0.0) {
    local_180 = sqrt(local_198);
  }
  else {
    local_180 = SQRT(local_198);
  }
  uVar5 = ref_mpi_allsum(ref_mpi,&local_1a0,1,3);
  if (uVar5 != 0) {
    pcVar10 = "dbl sum";
    uVar8 = 0xe8;
    goto LAB_001ccee0;
  }
  uVar5 = ref_mpi_allsum(ref_mpi,&local_110,1,2);
  if (uVar5 != 0) {
    pcVar10 = "cell int sum";
    uVar8 = 0xe9;
    goto LAB_001ccee0;
  }
  local_1a4 = 0;
  if (0 < (long)ref_node->max) {
    uVar9 = 0;
    uVar5 = 0;
    do {
      if ((-1 < ref_node->global[uVar9]) && (ref_node->ref_mpi->id == ref_node->part[uVar9])) {
        uVar5 = uVar5 + 1;
        local_1a4 = uVar5;
      }
      uVar9 = uVar9 + 1;
    } while (uVar9 < (ulong)(long)ref_node->max);
  }
  uVar5 = ref_mpi_allsum(ref_mpi,&local_1a4,1,1);
  if (uVar5 != 0) {
    pcVar10 = "int sum";
    uVar8 = 0xf1;
    goto LAB_001ccee0;
  }
  local_100 = (double)(int)local_1a4 / local_1a0;
  local_1bc = 0;
  iVar11 = ref_node->max;
  uVar5 = 0;
  if (0 < iVar11) {
    lVar7 = 0;
    uVar5 = 0;
    do {
      if (-1 < ref_node->global[lVar7]) {
        uVar5 = ref_adj_degree(pRVar2->ref_adj,(REF_INT)lVar7,(REF_INT *)&local_154);
        if (uVar5 != 0) {
          pcVar10 = "cell degree";
          uVar8 = 0xf7;
          goto LAB_001ccee0;
        }
        uVar5 = local_154;
        if ((int)local_154 < (int)local_1bc) {
          uVar5 = local_1bc;
        }
        iVar11 = ref_node->max;
        local_1bc = uVar5;
      }
      lVar7 = lVar7 + 1;
    } while (lVar7 < iVar11);
  }
  local_154 = uVar5;
  uVar5 = ref_mpi_max(ref_mpi,&local_154,&local_1bc,1);
  if (uVar5 != 0) {
    pcVar10 = "mpi max";
    uVar8 = 0xfb;
    goto LAB_001ccee0;
  }
  uVar5 = ref_mpi_bcast(ref_mpi,&local_1bc,1,1);
  if (uVar5 != 0) {
    pcVar10 = "min";
    uVar8 = 0xfc;
    goto LAB_001ccee0;
  }
  local_1c0 = 0;
  if ((long)ref_node->max < 1) {
    local_dc = 0;
  }
  else {
    uVar9 = 0;
    local_dc = 0;
    do {
      if ((-1 < ref_node->global[uVar9]) &&
         (uVar5 = ref_node->age[uVar9], local_1c0 = local_dc, (int)local_dc <= (int)uVar5)) {
        local_dc = uVar5;
        local_1c0 = uVar5;
      }
      uVar9 = uVar9 + 1;
    } while (uVar9 < (ulong)(long)ref_node->max);
  }
  uVar5 = ref_mpi_max(ref_mpi,&local_dc,&local_1c0,1);
  if (uVar5 != 0) {
    pcVar10 = "mpi max";
    uVar8 = 0x103;
    goto LAB_001ccee0;
  }
  uVar5 = ref_mpi_bcast(ref_mpi,&local_1c0,1,1);
  if (uVar5 != 0) {
    pcVar10 = "min";
    uVar8 = 0x104;
    goto LAB_001ccee0;
  }
  local_1b0 = 2.0;
  if (((ref_grid->geom->model != (void *)0x0) || (ref_grid->geom->meshlink != (void *)0x0)) &&
     (pRVar2 = ref_grid->cell[3], 0 < pRVar2->max)) {
    iVar11 = 0;
    do {
      RVar6 = ref_cell_nodes(pRVar2,iVar11,local_a8);
      if (RVar6 == 0) {
        uVar5 = ref_geom_tri_norm_deviation(ref_grid,local_a8,&local_f8);
        if (uVar5 != 0) {
          pcVar10 = "norm dev";
          uVar8 = 0x10b;
          goto LAB_001ccee0;
        }
        if (local_f8 <= local_1b0) {
          local_1b0 = local_f8;
        }
      }
      iVar11 = iVar11 + 1;
    } while (iVar11 < pRVar2->max);
  }
  local_f8 = local_1b0;
  uVar5 = ref_mpi_min(ref_mpi,&local_f8,&local_1b0,3);
  if (uVar5 != 0) {
    pcVar10 = "mpi max";
    uVar8 = 0x110;
    goto LAB_001ccee0;
  }
  uVar5 = ref_mpi_bcast(ref_mpi,&local_1b0,1,3);
  if (uVar5 != 0) {
    pcVar10 = "min";
    uVar8 = 0x111;
    goto LAB_001ccee0;
  }
  local_140 = 1e+200;
  local_148 = -1e+200;
  uVar5 = ref_edge_create(&local_128,ref_grid);
  if (uVar5 != 0) {
    pcVar10 = "make edges";
    uVar8 = 0x115;
    goto LAB_001ccee0;
  }
  if (local_128->n < 1) {
    local_188 = 1e+200;
    local_150 = -1e+200;
  }
  else {
    local_188 = 1e+200;
    local_150 = -1e+200;
    lVar7 = 0;
    do {
      uVar5 = ref_edge_part(local_128,(REF_INT)lVar7,&local_18c);
      if (uVar5 != 0) {
        pcVar10 = "edge part";
        uVar8 = 0x117;
        goto LAB_001ccee0;
      }
      if (local_18c == ref_grid->mpi->id) {
        uVar5 = ref_node_ratio(ref_grid->node,local_128->e2n[lVar7 * 2],
                               local_128->e2n[lVar7 * 2 + 1],&local_120);
        if (uVar5 != 0) {
          pcVar10 = "rat";
          uVar8 = 0x11c;
          goto LAB_001ccee0;
        }
        if (local_120 <= local_188) {
          local_188 = local_120;
        }
        local_148 = local_150;
        local_140 = local_188;
        if (local_150 <= local_120) {
          local_150 = local_120;
          local_148 = local_120;
        }
      }
      lVar7 = lVar7 + 1;
    } while (lVar7 < local_128->n);
  }
  uVar5 = ref_edge_free(local_128);
  if (uVar5 != 0) {
    pcVar10 = "free edge";
    uVar8 = 0x121;
    goto LAB_001ccee0;
  }
  local_120 = local_188;
  uVar5 = ref_mpi_min(ref_mpi,&local_120,&local_140,3);
  if (uVar5 != 0) {
    pcVar10 = "mpi min";
    uVar8 = 0x123;
    goto LAB_001ccee0;
  }
  uVar5 = ref_mpi_bcast(ref_mpi,&local_140,1,3);
  if (uVar5 != 0) {
    pcVar10 = "min";
    uVar8 = 0x124;
    goto LAB_001ccee0;
  }
  local_120 = local_150;
  uVar5 = ref_mpi_max(ref_mpi,&local_120,&local_148,3);
  if (uVar5 != 0) {
    pcVar10 = "mpi max";
    uVar8 = 0x126;
    goto LAB_001ccee0;
  }
  uVar5 = ref_mpi_bcast(ref_mpi,&local_148,1,3);
  if (uVar5 != 0) {
    pcVar10 = "max";
    uVar8 = 0x127;
    goto LAB_001ccee0;
  }
  dVar12 = 0.1;
  if (local_1b0 <= 0.1) {
    dVar12 = local_1b0;
  }
  if (dVar12 <= 0.001) {
    dVar12 = 0.001;
  }
  local_1b8->post_min_normdev = dVar12;
  local_188 = 0.1;
  if (local_160 <= 0.1) {
    local_188 = local_160;
  }
  local_180 = 1.0 / local_180;
  if (local_188 <= 0.001) {
    local_188 = 0.001;
  }
  local_1b8->collapse_quality_absolute = local_188;
  local_1b8->smooth_min_quality = local_188;
  RVar13 = 1e-15;
  if (local_180 * 0.01 <= 1e-15) {
    RVar13 = local_180 * 0.01;
  }
  ref_node->min_volume = RVar13;
  local_1b8->split_ratio_growth = 0;
  if (ref_grid->interp != (REF_INTERP)0x0) {
    local_1b8->split_ratio_growth = ref_grid->interp->continuously;
  }
  RVar13 = local_140;
  if (local_1b8->collapse_ratio <= local_140) {
    RVar13 = local_1b8->collapse_ratio;
  }
  local_1b8->post_min_ratio = RVar13;
  dVar12 = local_148;
  if (local_148 <= local_1b8->split_ratio) {
    dVar12 = local_1b8->split_ratio;
  }
  bVar3 = 0.4 < RVar13;
  if (4.0 < dVar12 && bVar3) {
    RVar13 = RVar13 * (4.0 / dVar12);
  }
  bVar4 = 0.4 < RVar13;
  if ((1.6 < dVar12 && bVar4) && dVar12 < 3.5) {
    RVar13 = RVar13 * (1.4 / dVar12);
  }
  local_1b8->post_max_ratio = dVar12;
  if ((4.0 < dVar12 && bVar3) || ((1.6 < dVar12 && bVar4) && dVar12 < 3.5)) {
    local_1b8->post_min_ratio = RVar13;
  }
  dVar17 = 1.4142135623730951;
  if (local_104 < 1) {
    dVar17 = (double)(~-(ulong)(3.0 < local_100) & 0x3ff6a09e667f3bcd |
                     (ulong)((local_148 + 1.4142135623730951) * 0.5) & -(ulong)(3.0 < local_100));
  }
  local_1b8->split_ratio = dVar17;
  dVar14 = local_1b8->last_min_ratio - RVar13;
  if (dVar14 <= -dVar14) {
    dVar14 = -dVar14;
  }
  if (RVar13 * 0.01 <= dVar14) {
LAB_001ce1a7:
    *local_130 = 0;
  }
  else {
    dVar14 = local_1b8->last_max_ratio - dVar12;
    if (dVar14 <= -dVar14) {
      dVar14 = -dVar14;
    }
    if ((dVar12 * 0.01 <= dVar14) ||
       (((0x31 < (int)local_1c0 && ((3.0 <= dVar12 || (RVar13 <= 0.1)))) || (1.5 <= dVar17))))
    goto LAB_001ce1a7;
    *local_130 = 1;
    if (ref_grid->mpi->id == 0) {
      puts("termination recommended");
    }
  }
  uVar5 = ref_mpi_bcast(ref_mpi,local_130,1,1);
  if (uVar5 == 0) {
    local_1b8->last_min_ratio = local_1b8->post_min_ratio;
    local_1b8->last_max_ratio = local_1b8->post_max_ratio;
    if (ref_grid->mpi->id != 0) {
      return 0;
    }
    printf("limit quality %6.4f normdev %6.4f ratio %6.4f %6.2f split %6.2f\n",local_188,
           local_1b8->post_min_normdev,local_1b8->post_min_ratio,local_1b8->post_max_ratio,
           local_1b8->split_ratio);
    printf("max degree %d max age %d normdev %7.4f\n",local_1b0,(ulong)local_1bc,(ulong)local_1c0);
    printf("nnode %10d ncell %12ld complexity %12.1f ratio %5.2f\n",local_1a0,local_100,
           (ulong)local_1a4,local_110);
    printf("volume range %e %e metric %e floor %e\n",local_178,local_170,local_180,
           ref_node->min_volume);
    return 0;
  }
  pcVar10 = "done";
  uVar8 = 0x15c;
LAB_001ccee0:
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_adapt.c",uVar8,
         "ref_adapt_parameter",(ulong)uVar5,pcVar10);
  return uVar5;
}

Assistant:

REF_FCN static REF_STATUS ref_adapt_parameter(REF_GRID ref_grid,
                                              REF_BOOL *all_done) {
  REF_MPI ref_mpi = ref_grid_mpi(ref_grid);
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_ADAPT ref_adapt = ref_grid->adapt;
  REF_CELL ref_cell;
  REF_INT cell;
  REF_LONG ncell;
  REF_INT nodes[REF_CELL_MAX_SIZE_PER];
  REF_DBL det, max_det, complexity, min_metric_vol;
  REF_DBL quality, min_quality;
  REF_DBL normdev, min_normdev;
  REF_DBL volume, min_volume, max_volume;
  REF_DBL target_quality, target_normdev;
  REF_INT cell_node;
  REF_INT node, nnode;
  REF_DBL nodes_per_complexity;
  REF_INT degree, max_degree;
  REF_DBL ratio, min_ratio, max_ratio;
  REF_INT edge, part;
  REF_INT age, max_age;
  REF_EDGE ref_edge;
  REF_DBL m[6];
  REF_INT int_mixed, local_mixed;
  REF_BOOL mixed;

  int_mixed = 0;
  if (ref_cell_n(ref_grid_qua(ref_grid)) > 0 ||
      ref_cell_n(ref_grid_pyr(ref_grid)) > 0 ||
      ref_cell_n(ref_grid_pri(ref_grid)) > 0 ||
      ref_cell_n(ref_grid_hex(ref_grid)) > 0)
    int_mixed = 1;
  local_mixed = int_mixed;
  RSS(ref_mpi_max(ref_mpi, &local_mixed, &int_mixed, REF_INT_TYPE), "mpi max");
  mixed = (int_mixed > 0);

  if (ref_grid_twod(ref_grid) || ref_grid_surf(ref_grid)) {
    ref_cell = ref_grid_tri(ref_grid);
  } else {
    ref_cell = ref_grid_tet(ref_grid);
  }

  min_quality = 1.0;
  min_volume = REF_DBL_MAX;
  max_volume = REF_DBL_MIN;
  max_det = -1.0;
  complexity = 0.0;
  ncell = 0;
  each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
    if (ref_grid_twod(ref_grid) || ref_grid_surf(ref_grid)) {
      RSS(ref_node_tri_quality(ref_grid_node(ref_grid), nodes, &quality),
          "qual");
      RSS(ref_node_tri_area(ref_grid_node(ref_grid), nodes, &volume), "vol");
    } else {
      RSS(ref_node_tet_quality(ref_grid_node(ref_grid), nodes, &quality),
          "qual");
      RSS(ref_node_tet_vol(ref_grid_node(ref_grid), nodes, &volume), "vol");
    }
    min_quality = MIN(min_quality, quality);
    min_volume = MIN(min_volume, volume);
    max_volume = MAX(max_volume, volume);

    for (cell_node = 0; cell_node < ref_cell_node_per(ref_cell); cell_node++) {
      if (ref_node_owned(ref_node, nodes[cell_node])) {
        RSS(ref_node_metric_get(ref_node, nodes[cell_node], m), "get");
        RSS(ref_matrix_det_m(m, &det), "det");
        max_det = MAX(max_det, det);
        if (ref_grid_surf(ref_grid)) {
          REF_DBL area, normal[3], normal_projection;
          RSS(ref_node_tri_area(ref_grid_node(ref_grid), nodes, &area), "vol");
          RSS(ref_node_tri_normal(ref_grid_node(ref_grid), nodes, normal),
              "norm");

          if (REF_SUCCESS == ref_math_normalize(normal)) {
            normal_projection = ref_matrix_vt_m_v(m, normal);
            if (ref_math_divisible(det, normal_projection)) {
              if (det / normal_projection > 0.0) {
                complexity += sqrt(det / normal_projection) * area /
                              ((REF_DBL)ref_cell_node_per(ref_cell));
              }
            }
          }
        } else {
          if (det > 0.0) {
            complexity +=
                sqrt(det) * volume / ((REF_DBL)ref_cell_node_per(ref_cell));
          }
        }
      }
    }
    RSS(ref_cell_part(ref_cell, ref_node, cell, &part), "owner");
    if (part == ref_mpi_rank(ref_mpi)) ncell++;
  }
  quality = min_quality;
  RSS(ref_mpi_min(ref_mpi, &quality, &min_quality, REF_DBL_TYPE), "mpi min");
  RSS(ref_mpi_bcast(ref_mpi, &quality, 1, REF_DBL_TYPE), "mbast");
  volume = min_volume;
  RSS(ref_mpi_min(ref_mpi, &volume, &min_volume, REF_DBL_TYPE), "mpi min");
  RSS(ref_mpi_bcast(ref_mpi, &min_volume, 1, REF_DBL_TYPE), "bcast");
  volume = max_volume;
  RSS(ref_mpi_max(ref_mpi, &volume, &max_volume, REF_DBL_TYPE), "mpi max");
  RSS(ref_mpi_bcast(ref_mpi, &max_volume, 1, REF_DBL_TYPE), "bcast");
  det = max_det;
  RSS(ref_mpi_max(ref_mpi, &det, &max_det, REF_DBL_TYPE), "mpi max");
  RSS(ref_mpi_bcast(ref_mpi, &max_det, 1, REF_DBL_TYPE), "bcast");
  RAS(ref_math_divisible(1.0, sqrt(max_det)), "can not invert sqrt(max_det)");
  min_metric_vol = 1.0 / sqrt(max_det);

  RSS(ref_mpi_allsum(ref_mpi, &complexity, 1, REF_DBL_TYPE), "dbl sum");
  RSS(ref_mpi_allsum(ref_mpi, &ncell, 1, REF_LONG_TYPE), "cell int sum");

  nnode = 0;
  each_ref_node_valid_node(ref_node, node) {
    if (ref_node_owned(ref_node, node)) {
      nnode++;
    }
  }
  RSS(ref_mpi_allsum(ref_mpi, &nnode, 1, REF_INT_TYPE), "int sum");

  nodes_per_complexity = (REF_DBL)nnode / complexity;

  max_degree = 0;
  each_ref_node_valid_node(ref_node, node) {
    RSS(ref_adj_degree(ref_cell_adj(ref_cell), node, &degree), "cell degree");
    max_degree = MAX(max_degree, degree);
  }
  degree = max_degree;
  RSS(ref_mpi_max(ref_mpi, &degree, &max_degree, REF_INT_TYPE), "mpi max");
  RSS(ref_mpi_bcast(ref_mpi, &max_degree, 1, REF_INT_TYPE), "min");

  max_age = 0;
  each_ref_node_valid_node(ref_node, node) {
    max_age = MAX(max_age, ref_node_age(ref_node, node));
  }
  age = max_age;
  RSS(ref_mpi_max(ref_mpi, &age, &max_age, REF_INT_TYPE), "mpi max");
  RSS(ref_mpi_bcast(ref_mpi, &max_age, 1, REF_INT_TYPE), "min");

  min_normdev = 2.0;
  if (ref_geom_model_loaded(ref_grid_geom(ref_grid)) ||
      ref_geom_meshlinked(ref_grid_geom(ref_grid))) {
    ref_cell = ref_grid_tri(ref_grid);
    each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
      RSS(ref_geom_tri_norm_deviation(ref_grid, nodes, &normdev), "norm dev");
      min_normdev = MIN(min_normdev, normdev);
    }
  }
  normdev = min_normdev;
  RSS(ref_mpi_min(ref_mpi, &normdev, &min_normdev, REF_DBL_TYPE), "mpi max");
  RSS(ref_mpi_bcast(ref_mpi, &min_normdev, 1, REF_DBL_TYPE), "min");

  min_ratio = REF_DBL_MAX;
  max_ratio = REF_DBL_MIN;
  RSS(ref_edge_create(&ref_edge, ref_grid), "make edges");
  for (edge = 0; edge < ref_edge_n(ref_edge); edge++) {
    RSS(ref_edge_part(ref_edge, edge, &part), "edge part");
    if (part == ref_mpi_rank(ref_grid_mpi(ref_grid))) {
      RSS(ref_node_ratio(ref_grid_node(ref_grid),
                         ref_edge_e2n(ref_edge, 0, edge),
                         ref_edge_e2n(ref_edge, 1, edge), &ratio),
          "rat");
      min_ratio = MIN(min_ratio, ratio);
      max_ratio = MAX(max_ratio, ratio);
    }
  }
  RSS(ref_edge_free(ref_edge), "free edge");
  ratio = min_ratio;
  RSS(ref_mpi_min(ref_mpi, &ratio, &min_ratio, REF_DBL_TYPE), "mpi min");
  RSS(ref_mpi_bcast(ref_mpi, &min_ratio, 1, REF_DBL_TYPE), "min");
  ratio = max_ratio;
  RSS(ref_mpi_max(ref_mpi, &ratio, &max_ratio, REF_DBL_TYPE), "mpi max");
  RSS(ref_mpi_bcast(ref_mpi, &max_ratio, 1, REF_DBL_TYPE), "max");

  target_normdev = MAX(MIN(0.1, min_normdev), 1.0e-3);
  ref_adapt->post_min_normdev = target_normdev;

  target_quality = MAX(MIN(0.1, min_quality), 1.0e-3);
  ref_adapt->collapse_quality_absolute = target_quality;
  ref_adapt->smooth_min_quality = target_quality;

  ref_node->min_volume = MIN(1.0e-15, 0.01 * min_metric_vol);

  /* allow edge growth when interpolating metric continuously */
  ref_adapt->split_ratio_growth = REF_FALSE;
  if (NULL != ref_grid_interp(ref_grid)) {
    ref_adapt->split_ratio_growth =
        ref_interp_continuously(ref_grid_interp(ref_grid));
  }

  /* bound ratio to current range */
  ref_adapt->post_min_ratio = MIN(min_ratio, ref_adapt->collapse_ratio);
  ref_adapt->post_max_ratio = MAX(max_ratio, ref_adapt->split_ratio);

  if (ref_adapt->post_max_ratio > 4.0 && ref_adapt->post_min_ratio > 0.4) {
    ref_adapt->post_min_ratio =
        (4.0 / ref_adapt->post_max_ratio) * ref_adapt->post_min_ratio;
  }

  /* when close to convergence, prevent high lower limit from stopping split */
  if (ref_adapt->post_max_ratio < 3.5 && ref_adapt->post_max_ratio > 1.6 &&
      ref_adapt->post_min_ratio > 0.4) {
    ref_adapt->post_min_ratio =
        (1.4 / ref_adapt->post_max_ratio) * ref_adapt->post_min_ratio;
  }

  ref_adapt->split_ratio = sqrt(2.0);
  /* prevent overshoot of number of nodes, unless unreliable due to mixed */
  if (!mixed && nodes_per_complexity > 3.0)
    ref_adapt->split_ratio = 0.5 * (sqrt(2.0) + max_ratio);

  if (ABS(ref_adapt->last_min_ratio - ref_adapt->post_min_ratio) <
          1e-2 * ref_adapt->post_min_ratio &&
      ABS(ref_adapt->last_max_ratio - ref_adapt->post_max_ratio) <
          1e-2 * ref_adapt->post_max_ratio &&
      (max_age < 50 ||
       (ref_adapt->post_min_ratio > 0.1 && ref_adapt->post_max_ratio < 3.0)) &&
      1.5 > ref_adapt->split_ratio) {
    *all_done = REF_TRUE;
    if (ref_grid_once(ref_grid)) {
      printf("termination recommended\n");
    }
  } else {
    *all_done = REF_FALSE;
  }
  RSS(ref_mpi_bcast(ref_mpi, all_done, 1, REF_INT_TYPE), "done");

  ref_adapt->last_min_ratio = ref_adapt->post_min_ratio;
  ref_adapt->last_max_ratio = ref_adapt->post_max_ratio;

  if (ref_grid_once(ref_grid)) {
    printf("limit quality %6.4f normdev %6.4f ratio %6.4f %6.2f split %6.2f\n",
           target_quality, ref_adapt->post_min_normdev,
           ref_adapt->post_min_ratio, ref_adapt->post_max_ratio,
           ref_adapt->split_ratio);
    printf("max degree %d max age %d normdev %7.4f\n", max_degree, max_age,
           min_normdev);
    printf("nnode %10d ncell %12ld complexity %12.1f ratio %5.2f\n", nnode,
           ncell, complexity, nodes_per_complexity);
    printf("volume range %e %e metric %e floor %e\n", max_volume, min_volume,
           min_metric_vol, ref_node->min_volume);
  }

  return REF_SUCCESS;
}